

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void minmaxStep(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  uint uVar1;
  Mem *pMem2;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  Mem *pMem1;
  
  pMem2 = *argv;
  if ((context->pMem->flags & 0x2000) == 0) {
    pMem1 = (Mem *)createAggContext(context,0x38);
  }
  else {
    pMem1 = (Mem *)context->pMem->z;
  }
  if (pMem1 != (Mem *)0x0) {
    uVar1._0_2_ = pMem2->flags;
    uVar1._2_1_ = pMem2->enc;
    uVar1._3_1_ = pMem2->eSubtype;
    if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      if (pMem1->flags == 0) {
        pMem1->db = context->pOut->db;
LAB_001bce88:
        sqlite3VdbeMemCopy(pMem1,pMem2);
        return;
      }
      pvVar2 = context->pFunc->pUserData;
      iVar4 = sqlite3MemCompare(pMem1,pMem2,context->pVdbe->aOp[(long)context->iOp + -1].p4.pColl);
      bVar3 = -1 < iVar4;
      if (pvVar2 == (void *)0x0) {
        bVar3 = iVar4 < 1;
      }
      if (!bVar3) goto LAB_001bce88;
    }
    else if (pMem1->flags == 0) {
      return;
    }
    context->isError = -1;
    context->skipFlag = '\x01';
  }
  return;
}

Assistant:

static void minmaxStep(
  sqlite3_context *context, 
  int NotUsed, 
  sqlite3_value **argv
){
  Mem *pArg  = (Mem *)argv[0];
  Mem *pBest;
  UNUSED_PARAMETER(NotUsed);

  pBest = (Mem *)sqlite3_aggregate_context(context, sizeof(*pBest));
  if( !pBest ) return;

  if( sqlite3_value_type(pArg)==SQLITE_NULL ){
    if( pBest->flags ) sqlite3SkipAccumulatorLoad(context);
  }else if( pBest->flags ){
    int max;
    int cmp;
    CollSeq *pColl = sqlite3GetFuncCollSeq(context);
    /* This step function is used for both the min() and max() aggregates,
    ** the only difference between the two being that the sense of the
    ** comparison is inverted. For the max() aggregate, the
    ** sqlite3_user_data() function returns (void *)-1. For min() it
    ** returns (void *)db, where db is the sqlite3* database pointer.
    ** Therefore the next statement sets variable 'max' to 1 for the max()
    ** aggregate, or 0 for min().
    */
    max = sqlite3_user_data(context)!=0;
    cmp = sqlite3MemCompare(pBest, pArg, pColl);
    if( (max && cmp<0) || (!max && cmp>0) ){
      sqlite3VdbeMemCopy(pBest, pArg);
    }else{
      sqlite3SkipAccumulatorLoad(context);
    }
  }else{
    pBest->db = sqlite3_context_db_handle(context);
    sqlite3VdbeMemCopy(pBest, pArg);
  }
}